

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::apply
          (QControlledGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  reference pvVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<float> *pcVar9;
  byte bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  complex<float> local_230;
  complex<float> local_228;
  _ComplexT local_220;
  complex<float> local_218;
  complex<float> local_210;
  _ComplexT local_208;
  complex<float> local_200;
  complex<float> x2_3;
  complex<float> x1_3;
  int64_t i2_1;
  int64_t i1_1;
  int64_t i_3;
  int64_t k_3;
  int64_t j_3;
  complex<float> local_1c0;
  _ComplexT local_1b8;
  complex<float> local_1b0;
  complex<float> local_1a8;
  _ComplexT local_1a0;
  complex<float> local_198;
  complex<float> x2_2;
  complex<float> x1_2;
  int64_t j2_1;
  int64_t j1_1;
  int64_t j_2;
  int64_t k_2;
  int64_t i_2;
  int64_t nRight_1;
  int64_t nLeft_1;
  int64_t d_1;
  complex<float> local_140;
  _ComplexT local_138;
  complex<float> local_130;
  complex<float> local_128;
  _ComplexT local_120;
  complex<float> local_118;
  complex<float> x2_1;
  complex<float> x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  complex<float> local_d8;
  _ComplexT local_d0;
  complex<float> local_c8;
  complex<float> local_c0;
  _ComplexT local_b8;
  complex<float> local_b0;
  complex<float> x2;
  complex<float> x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  int64_t d;
  undefined1 local_50 [8];
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<std::complex<float>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QControlledGate2<std::complex<float>_> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar4 = dense::SquareMatrix<std::complex<float>_>::size(matrix);
  bVar10 = (byte)nbQubits;
  if (iVar4 != 1 << (bVar10 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (&mat1.data_);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (op,(SquareMatrix<std::complex<float>_> *)local_50);
  iVar2 = control(this);
  iVar3 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[0xf])();
  if (iVar2 < iVar3) {
    iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    iVar3 = control(this);
    lVar6 = (long)(1 << ((char)iVar2 - (char)iVar3 & 0x1fU));
    iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    lVar7 = (long)(1 << ((byte)iVar2 & 0x1f));
    iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    lVar8 = (long)(1 << ((bVar10 - (char)iVar2) - 1 & 0x1f));
    if (side == Left) {
      for (k = 0; iVar4 = dense::SquareMatrix<std::complex<float>_>::rows(matrix), k < iVar4;
          k = k + 1) {
        for (j = 0; j < lVar7; j = j + 1) {
          if (((this->controlState_ != 0) || (j % lVar6 < lVar6 / 2)) &&
             ((this->controlState_ != 1 || (lVar6 / 2 <= j % lVar6)))) {
            for (j1 = 0; j1 < lVar8; j1 = j1 + 1) {
              lVar1 = j1 + j * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1);
              x2._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1 + lVar8)
              ;
              local_b0._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,0);
              std::operator*(pcVar9,&x2);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,0);
              std::operator*(pcVar9,&local_b0);
              std::operator+(&local_c0,&local_c8);
              local_b8 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1);
              pcVar9->_M_value = local_b8;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,1);
              std::operator*(pcVar9,&x2);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,1);
              std::operator*(pcVar9,&local_b0);
              std::operator+(&local_d8,(complex<float> *)&j_1);
              local_d0 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k,lVar1 + lVar8)
              ;
              pcVar9->_M_value = local_d0;
            }
          }
        }
      }
    }
    else {
      for (k_1 = 0; iVar4 = dense::SquareMatrix<std::complex<float>_>::cols(matrix), k_1 < iVar4;
          k_1 = k_1 + 1) {
        for (i_1 = 0; i_1 < lVar7; i_1 = i_1 + 1) {
          if (((this->controlState_ != 0) || (i_1 % lVar6 < lVar6 / 2)) &&
             ((this->controlState_ != 1 || (lVar6 / 2 <= i_1 % lVar6)))) {
            for (i1 = 0; i1 < lVar8; i1 = i1 + 1) {
              lVar1 = i1 + i_1 * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_1);
              x2_1._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 (matrix,lVar1 + lVar8,k_1);
              local_118._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,0);
              std::operator*(pcVar9,&x2_1);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,1);
              std::operator*(pcVar9,&local_118);
              std::operator+(&local_128,&local_130);
              local_120 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_1);
              pcVar9->_M_value = local_120;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,0);
              std::operator*(pcVar9,&x2_1);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,1);
              std::operator*(pcVar9,&local_118);
              std::operator+(&local_140,(complex<float> *)&d_1);
              local_138 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 (matrix,lVar1 + lVar8,k_1);
              pcVar9->_M_value = local_138;
            }
          }
        }
      }
    }
  }
  else {
    iVar2 = control(this);
    lVar6 = (long)(1 << (bVar10 - (char)iVar2 & 0x1f));
    iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    lVar7 = (long)(1 << ((byte)iVar2 & 0x1f));
    iVar2 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    lVar8 = (long)(1 << ((bVar10 - (char)iVar2) - 1 & 0x1f));
    if (side == Left) {
      for (k_2 = 0; iVar4 = dense::SquareMatrix<std::complex<float>_>::cols(matrix), k_2 < iVar4;
          k_2 = k_2 + 1) {
        for (j_2 = 0; j_2 < lVar7; j_2 = j_2 + 1) {
          for (j1_1 = 0; j1_1 < lVar8; j1_1 = j1_1 + 1) {
            if (((this->controlState_ != 0) || (j1_1 % lVar6 < lVar6 / 2)) &&
               ((this->controlState_ != 1 || (lVar6 / 2 <= j1_1 % lVar6)))) {
              lVar1 = j1_1 + j_2 * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k_2,lVar1);
              x2_2._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 (matrix,k_2,lVar1 + lVar8);
              local_198._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,0);
              std::operator*(pcVar9,&x2_2);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,0);
              std::operator*(pcVar9,&local_198);
              std::operator+(&local_1a8,&local_1b0);
              local_1a0 = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,k_2,lVar1);
              pcVar9->_M_value = local_1a0;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,1);
              std::operator*(pcVar9,&x2_2);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,1);
              std::operator*(pcVar9,&local_198);
              std::operator+(&local_1c0,(complex<float> *)&j_3);
              local_1b8 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 (matrix,k_2,lVar1 + lVar8);
              pcVar9->_M_value = local_1b8;
            }
          }
        }
      }
    }
    else {
      for (k_3 = 0; iVar4 = dense::SquareMatrix<std::complex<float>_>::cols(matrix), k_3 < iVar4;
          k_3 = k_3 + 1) {
        for (i_3 = 0; i_3 < lVar7; i_3 = i_3 + 1) {
          for (i1_1 = 0; i1_1 < lVar8; i1_1 = i1_1 + 1) {
            if (((this->controlState_ != 0) || (i1_1 % lVar6 < lVar6 / 2)) &&
               ((this->controlState_ != 1 || (lVar6 / 2 <= i1_1 % lVar6)))) {
              lVar1 = i1_1 + i_3 * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_3);
              x2_3._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 (matrix,lVar1 + lVar8,k_3);
              local_200._M_value = pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,0);
              std::operator*(pcVar9,&x2_3);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,0,1);
              std::operator*(pcVar9,&local_200);
              std::operator+(&local_210,&local_218);
              local_208 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()(matrix,lVar1,k_3);
              pcVar9->_M_value = local_208;
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,0);
              std::operator*(pcVar9,&x2_3);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 ((SquareMatrix<std::complex<float>_> *)local_50,1,1);
              std::operator*(pcVar9,&local_200);
              std::operator+(&local_228,&local_230);
              local_220 = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
              pcVar9 = dense::SquareMatrix<std::complex<float>_>::operator()
                                 (matrix,lVar1 + lVar8,k_3);
              pcVar9->_M_value = local_220;
            }
          }
        }
      }
    }
  }
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat1.data_);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }